

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam000000000017efb0 = 0x2d2d2d2d2d2d2d;
    uRam000000000017efb7._0_1_ = '-';
    uRam000000000017efb7._1_1_ = '-';
    uRam000000000017efb7._2_1_ = '-';
    uRam000000000017efb7._3_1_ = '-';
    uRam000000000017efb7._4_1_ = '-';
    uRam000000000017efb7._5_1_ = '-';
    uRam000000000017efb7._6_1_ = '-';
    uRam000000000017efb7._7_1_ = '-';
    DAT_0017efa0 = '-';
    DAT_0017efa0_1._0_1_ = '-';
    DAT_0017efa0_1._1_1_ = '-';
    DAT_0017efa0_1._2_1_ = '-';
    DAT_0017efa0_1._3_1_ = '-';
    DAT_0017efa0_1._4_1_ = '-';
    DAT_0017efa0_1._5_1_ = '-';
    DAT_0017efa0_1._6_1_ = '-';
    uRam000000000017efa8 = 0x2d2d2d2d2d2d2d;
    DAT_0017efaf = 0x2d;
    DAT_0017ef90 = '-';
    DAT_0017ef90_1._0_1_ = '-';
    DAT_0017ef90_1._1_1_ = '-';
    DAT_0017ef90_1._2_1_ = '-';
    DAT_0017ef90_1._3_1_ = '-';
    DAT_0017ef90_1._4_1_ = '-';
    DAT_0017ef90_1._5_1_ = '-';
    DAT_0017ef90_1._6_1_ = '-';
    uRam000000000017ef98._0_1_ = '-';
    uRam000000000017ef98._1_1_ = '-';
    uRam000000000017ef98._2_1_ = '-';
    uRam000000000017ef98._3_1_ = '-';
    uRam000000000017ef98._4_1_ = '-';
    uRam000000000017ef98._5_1_ = '-';
    uRam000000000017ef98._6_1_ = '-';
    uRam000000000017ef98._7_1_ = '-';
    DAT_0017ef80 = '-';
    DAT_0017ef80_1._0_1_ = '-';
    DAT_0017ef80_1._1_1_ = '-';
    DAT_0017ef80_1._2_1_ = '-';
    DAT_0017ef80_1._3_1_ = '-';
    DAT_0017ef80_1._4_1_ = '-';
    DAT_0017ef80_1._5_1_ = '-';
    DAT_0017ef80_1._6_1_ = '-';
    uRam000000000017ef88._0_1_ = '-';
    uRam000000000017ef88._1_1_ = '-';
    uRam000000000017ef88._2_1_ = '-';
    uRam000000000017ef88._3_1_ = '-';
    uRam000000000017ef88._4_1_ = '-';
    uRam000000000017ef88._5_1_ = '-';
    uRam000000000017ef88._6_1_ = '-';
    uRam000000000017ef88._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam000000000017ef78._0_1_ = '-';
    uRam000000000017ef78._1_1_ = '-';
    uRam000000000017ef78._2_1_ = '-';
    uRam000000000017ef78._3_1_ = '-';
    uRam000000000017ef78._4_1_ = '-';
    uRam000000000017ef78._5_1_ = '-';
    uRam000000000017ef78._6_1_ = '-';
    uRam000000000017ef78._7_1_ = '-';
    DAT_0017efbf = 0;
  }
  poVar1 = std::operator<<((ostream *)
                           (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void ConsoleReporter::printSummaryDivider() {
    stream << getLineOfChars<'-'>() << '\n';
}